

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

TRef lj_opt_dse_fstore(jit_State *J)

{
  IRType1 *pIVar1;
  ushort uVar2;
  IRRef1 IVar3;
  bool bVar4;
  AliasRet AVar5;
  int iVar6;
  uint uVar7;
  TRef TVar8;
  IRIns *pIVar9;
  IRIns *pIVar10;
  uint uVar11;
  IRIns *refa;
  IRRef1 *local_38;
  
  uVar2 = (J->fold).ins.field_0.op1;
  refa = (IRIns *)((ulong)((uint)uVar2 * 8) + (long)(J->cur).ir);
  IVar3 = (J->fold).ins.field_0.op2;
  local_38 = J->chain + 0x4d;
  uVar11 = (uint)J->chain[0x4d];
  do {
    if (uVar11 <= uVar2) goto LAB_0015751a;
    pIVar9 = (J->cur).ir;
    pIVar10 = pIVar9 + uVar11;
    AVar5 = aa_fref(J,refa,pIVar9 + (pIVar10->field_0).op1);
    if (AVar5 == ALIAS_MUST) {
      if (((pIVar10->field_0).op2 != IVar3) || (iVar6 = 1, (ushort)((refa->field_0).op2 - 0x10) < 6)
         ) {
        if (J->chain[0x11] < uVar11) {
          uVar7 = (J->cur).nins - 1;
          bVar4 = uVar11 < uVar7;
          if (uVar11 < uVar7) {
            iVar6 = 5;
            if (-1 < *(char *)((long)pIVar9 + (ulong)uVar7 * 8 + 4)) {
              pIVar9 = pIVar9 + ((ulong)uVar7 - 1);
              do {
                if ((*(char *)((long)pIVar9 + 0xd) == 'E') &&
                   (*(IRRef1 *)((long)pIVar9 + 10) == (refa->field_0).op2)) break;
                bVar4 = pIVar10 < pIVar9;
                if (pIVar9 <= pIVar10) goto LAB_001574e5;
                pIVar1 = &(pIVar9->field_1).t;
                pIVar9 = pIVar9 + -1;
              } while (-1 < (char)pIVar1->irt);
            }
          }
          else {
LAB_001574e5:
            *local_38 = (pIVar10->field_0).prev;
            *pIVar10 = (IRIns)0xc0000000000;
            iVar6 = 0;
          }
          if (bVar4) goto LAB_0015750d;
        }
        iVar6 = 5;
      }
    }
    else if ((AVar5 != ALIAS_MAY) || (iVar6 = 5, (pIVar10->field_0).op2 == IVar3)) {
      uVar11 = (uint)(pIVar10->field_0).prev;
      local_38 = &(pIVar10->field_0).prev;
      iVar6 = 0;
    }
LAB_0015750d:
  } while (iVar6 == 0);
  if (iVar6 != 5) {
    return 4;
  }
LAB_0015751a:
  TVar8 = lj_ir_emit(J);
  return TVar8;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_fstore(jit_State *J)
{
  IRRef fref = fins->op1;  /* FREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(fref);
  IRRef1 *refp = &J->chain[IR_FSTORE];
  IRRef ref = *refp;
  while (ref > fref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_fref(J, xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:
      if (store->op2 == val &&
	  !(xr->op2 >= IRFL_SBUF_W && xr->op2 <= IRFL_SBUF_R))
	return DROPFOLD;  /* Same value: drop the new store. */
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards or conflicting loads. */
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t) || (ir->o == IR_FLOAD && ir->op2 == xr->op2))
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	lj_ir_nop(store);
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}